

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_no_parse.cpp
# Opt level: O2

void TestMADPconstructors(Arguments *args)

{
  allocator<char> local_273;
  allocator<char> local_272;
  allocator<char> local_271;
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  MultiAgentDecisionProcessDiscrete madpd;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_230,"received unspec. by MultiAgentDecisionProcessDiscrete",&local_271);
  std::__cxx11::string::string<std::allocator<char>>
            (local_250,"received unspec.by MultiAgentDecisionProcessDiscrete",&local_272);
  std::__cxx11::string::string<std::allocator<char>>
            (local_270,"received unspec. by MultiAgentDecisionProcessDiscrete",&local_273);
  MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete
            (&madpd,2,2,local_230,local_250,local_270);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string(local_230);
  MultiAgentDecisionProcessDiscrete::~MultiAgentDecisionProcessDiscrete(&madpd);
  return;
}

Assistant:

void TestMADPconstructors(const ArgumentHandlers::Arguments& args)
{
    const int NRAGENTS = 2;
    const int NRSTATES = 2;
    MultiAgentDecisionProcessDiscrete madpd(NRAGENTS, NRSTATES);
}